

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O0

void __thiscall
S2EdgeTessellator::AppendProjected
          (S2EdgeTessellator *this,S2Point *a,S2Point *b,
          vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *vertices)

{
  Projection *this_00;
  bool bVar1;
  reference a_00;
  BasicVector<Vector2,_double,_2UL> *this_01;
  ostream *poVar2;
  VType extraout_XMM0_Qa;
  VType in_XMM1_Qa;
  undefined1 local_88 [8];
  R2Point pb;
  S2LogMessage local_60;
  S2LogMessageVoidify local_49;
  VType local_48 [2];
  undefined1 local_38 [8];
  R2Point pa;
  vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *vertices_local;
  S2Point *b_local;
  S2Point *a_local;
  S2EdgeTessellator *this_local;
  
  pa.c_[1] = (VType)vertices;
  (*this->proj_->_vptr_Projection[2])(this->proj_,a);
  local_38 = (undefined1  [8])extraout_XMM0_Qa;
  pa.c_[0] = in_XMM1_Qa;
  bVar1 = std::vector<Vector2<double>,_std::allocator<Vector2<double>_>_>::empty
                    ((vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *)pa.c_[1]);
  if (bVar1) {
    std::vector<Vector2<double>,_std::allocator<Vector2<double>_>_>::push_back
              ((vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *)pa.c_[1],
               (value_type *)local_38);
  }
  else {
    this_00 = this->proj_;
    a_00 = std::vector<Vector2<double>,_std::allocator<Vector2<double>_>_>::back
                     ((vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *)pa.c_[1]);
    local_48 = (VType  [2])S2::Projection::WrapDestination(this_00,a_00,(R2Point *)local_38);
    in_XMM1_Qa = local_48[1];
    local_38 = (undefined1  [8])local_48[0];
    pa.c_[0] = in_XMM1_Qa;
    this_01 = (BasicVector<Vector2,_double,_2UL> *)
              std::vector<Vector2<double>,_std::allocator<Vector2<double>_>_>::back
                        ((vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *)pa.c_[1]);
    bVar1 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator==
                      (this_01,(D *)local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xda,kFatal,(ostream *)&std::cerr);
      poVar2 = S2LogMessage::stream(&local_60);
      poVar2 = std::operator<<(poVar2,"Check failed: (vertices->back()) == (pa) ");
      poVar2 = std::operator<<(poVar2,"Appended edges must form a chain");
      S2LogMessageVoidify::operator&(&local_49,poVar2);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
    }
  }
  (*this->proj_->_vptr_Projection[2])(this->proj_,b);
  pb.c_[0] = in_XMM1_Qa;
  AppendProjected(this,(R2Point *)local_38,a,(R2Point *)local_88,b,
                  (vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *)pa.c_[1]);
  return;
}

Assistant:

void S2EdgeTessellator::AppendProjected(
    const S2Point& a, const S2Point& b, vector<R2Point>* vertices) const {
  R2Point pa = proj_.Project(a);
  if (vertices->empty()) {
    vertices->push_back(pa);
  } else {
    pa = proj_.WrapDestination(vertices->back(), pa);
    S2_DCHECK_EQ(vertices->back(), pa) << "Appended edges must form a chain";
  }
  R2Point pb = proj_.Project(b);
  AppendProjected(pa, a, pb, b, vertices);
}